

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O0

UnicodeString * __thiscall
booster::locale::impl_icu::icu_std_converter<wchar_t,_4>::icu_checked
          (icu_std_converter<wchar_t,_4> *this,char_type_conflict *begin,char_type_conflict *end)

{
  uint uVar1;
  uint *in_RCX;
  uint *in_RDX;
  icu_std_converter<wchar_t,_4> *in_RSI;
  UnicodeString *in_RDI;
  UChar32 c;
  UnicodeString *tmp;
  uint *local_18;
  
  icu_70::UnicodeString::UnicodeString(in_RDI,(int)((long)in_RCX - (long)in_RDX >> 2),0,0);
  local_18 = in_RDX;
  while (local_18 != in_RCX) {
    uVar1 = *local_18;
    if ((uVar1 < 0xd800) ||
       (((0xdfff < (int)uVar1 && ((int)uVar1 < 0x110000)) &&
        (((int)uVar1 < 0xfdd0 ||
         (((0xfdef < (int)uVar1 && ((uVar1 & 0xfffe) != 0xfffe)) || (0x10ffff < (int)uVar1)))))))) {
      icu_70::UnicodeString::append((int)in_RDI);
      local_18 = local_18 + 1;
    }
    else {
      throw_if_needed(in_RSI);
      local_18 = local_18 + 1;
    }
  }
  return in_RDI;
}

Assistant:

icu::UnicodeString icu_checked(char_type const *begin,char_type const *end) const
        {
            icu::UnicodeString tmp(end-begin,0,0); // make inital capacity
            while(begin!=end) {
                UChar32 c = static_cast<UChar32>(*begin++);
                if(U_IS_UNICODE_CHAR(c))
                        tmp.append(c);
                else
                    throw_if_needed();
            }
            return tmp;
        }